

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_38a::NinjaMain::CollectTargetsFromArgs
          (NinjaMain *this,int argc,char **argv,vector<Node_*,_std::allocator<Node_*>_> *targets,
          string *err)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  Node *node;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_48;
  
  if (argc == 0) {
    State::DefaultNodes((vector<Node_*,_std::allocator<Node_*>_> *)&local_48,&this->state_,err);
    std::vector<Node_*,_std::allocator<Node_*>_>::_M_move_assign(targets,&local_48);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_48);
    bVar3 = err->_M_string_length == 0;
  }
  else {
    uVar1 = 0;
    uVar2 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start =
           (pointer)CollectTarget(this,argv[uVar1],err);
      if ((Node *)local_48._M_impl.super__Vector_impl_data._M_start == (Node *)0x0) {
        return false;
      }
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(targets,(value_type *)&local_48);
    }
    bVar3 = (long)argc <= (long)uVar1;
  }
  return bVar3;
}

Assistant:

bool NinjaMain::CollectTargetsFromArgs(int argc, char* argv[],
                                       vector<Node*>* targets, string* err) {
  if (argc == 0) {
    *targets = state_.DefaultNodes(err);
    return err->empty();
  }

  for (int i = 0; i < argc; ++i) {
    Node* node = CollectTarget(argv[i], err);
    if (node == NULL)
      return false;
    targets->push_back(node);
  }
  return true;
}